

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Node * __thiscall Parser::statement(Parser *this)

{
  code *pcVar1;
  bool bVar2;
  Node *println_node;
  Node *cycle_for_node;
  Node *selection_node;
  Node *assign_node;
  Node *declaration_node;
  Node *compound_node;
  Parser *this_local;
  
  bVar2 = tryEat(this,LBRACE);
  if (bVar2) {
    this_local = (Parser *)compound_statement(this);
  }
  else {
    bVar2 = tryEat(this,LET);
    if (bVar2) {
      this_local = (Parser *)declaration(this);
    }
    else {
      bVar2 = tryEat(this,IDENTIFIER);
      if (bVar2) {
        this_local = (Parser *)set(this);
      }
      else {
        bVar2 = tryEat(this,IF);
        if (bVar2) {
          this_local = (Parser *)selection_statement(this);
        }
        else {
          bVar2 = tryEat(this,FOR);
          if (bVar2) {
            this_local = (Parser *)cycle_for(this);
          }
          else {
            bVar2 = tryEat(this,PRINTLN);
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            this_local = (Parser *)println(this);
          }
        }
      }
    }
  }
  return (Node *)this_local;
}

Assistant:

Node* Parser::statement()
{
	if (tryEat(token_type::LBRACE)) {
		Node* compound_node = compound_statement();
		return compound_node;
	}
	else if (tryEat(token_type::LET)) {
		Node* declaration_node = declaration();
		return declaration_node;
	}
	else if (tryEat(token_type::IDENTIFIER)) {
		Node* assign_node = set();
		return assign_node;
	}
	else if (tryEat(token_type::IF)) {
		Node* selection_node = selection_statement();
		return selection_node;
	}
	else if (tryEat(token_type::FOR)) {
		Node* cycle_for_node = cycle_for();
		return cycle_for_node;
	}
	else if (tryEat(token_type::PRINTLN)) {
		Node* println_node = println();
		return println_node;
	}
}